

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O1

void __thiscall cmQtAutoMocUic::UicSettingsT::UicSettingsT(UicSettingsT *this)

{
  _Rb_tree_header *p_Var1;
  
  this->Enabled = false;
  this->SettingsChanged = false;
  (this->ExecutableTime).NS = 0;
  (this->Executable)._M_dataplus._M_p = (pointer)&(this->Executable).field_2;
  (this->Executable)._M_string_length = 0;
  (this->Executable).field_2._M_local_buf[0] = '\0';
  (this->SkipList)._M_h._M_buckets = &(this->SkipList)._M_h._M_single_bucket;
  (this->SkipList)._M_h._M_bucket_count = 1;
  (this->SkipList)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->SkipList)._M_h._M_element_count = 0;
  (this->SkipList)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->Options)._M_t._M_impl.super__Rb_tree_header;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SkipList)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->SkipList)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->TargetOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TargetOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TargetOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->RegExpInclude).regmatch.endp[0] = (char *)0x0;
  (this->RegExpInclude).regmatch.searchstring = (char *)0x0;
  (this->RegExpInclude).program = (char *)0x0;
  (this->RegExpInclude).regmatch.startp[0] = (char *)0x0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmsys::RegularExpression::compile
            (&this->RegExpInclude,
             "(^|\n)[ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");
  return;
}

Assistant:

cmQtAutoMocUic::UicSettingsT::UicSettingsT()
{
  RegExpInclude.compile("(^|\n)[ \t]*#[ \t]*include[ \t]+"
                        "[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");
}